

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void phmap::priv::
     InputIteratorBucketAllocTest<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
               (void)

{
  size_t sz;
  long lVar1;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> values;
  A alloc;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  m;
  AssertHelper local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_500;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e0;
  undefined8 uStack_4d8;
  long local_4d0;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  local_4c8;
  __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  _Stack_4c0;
  long local_4b8;
  allocator_type local_4b0;
  undefined4 local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a0;
  undefined8 uStack_498;
  long local_490;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_488;
  
  local_4b0.id_ = 0;
  local_4b8 = 0;
  local_4c8._M_current = (pair<const_int,_int> *)0x0;
  _Stack_4c0._M_current = (pair<const_int,_int> *)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,int>,void>>
            (&local_4c8,10);
  local_4e8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                        next_id<phmap::priv::StatefulTestingEqual>()::gId->first + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  parallel_hash_set<__gnu_cxx::__normal_iterator<std::pair<int_const,int>*,std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_488,local_4c8,_Stack_4c0,0x7b,(hasher *)&local_4e8,(key_equal *)&local_500,
             &local_4b0);
  local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_488.sets_._M_elems[0].set_.settings_.
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .
                super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                .super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>.
                super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_false>.
                _M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<int_const,int>>,phmap::priv::Alloc<std::pair<int_const,int>>>
            ((internal *)&local_4e8,"m.get_allocator()","alloc",
             (Alloc<std::pair<const_int,_int>_> *)&local_500,&local_4b0);
  if (local_4e8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_500);
    if (local_4e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_4e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    if (local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_500.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_4e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4e0,local_4e0);
  }
  local_4a8 = 3;
  std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>::
  vector<__gnu_cxx::__normal_iterator<std::pair<int_const,int>const*,std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,void>
            ((vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>> *)&local_4a0
             ,(__normal_iterator<const_std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
               )local_4c8._M_current,
             (__normal_iterator<const_std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              )_Stack_4c0._M_current,(allocator_type *)&local_500);
  local_4d0 = local_490;
  uStack_4d8 = uStack_498;
  local_4e0 = local_4a0;
  local_4a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uStack_498 = 0;
  local_490 = 0;
  local_4e8._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_4a8;
  items<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
            (&local_500,(priv *)&local_488,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(&local_510,(char *)&local_4e8,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  if (local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4e0,local_4d0 - (long)local_4e0);
  }
  if (local_4a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_4a0,local_490 - (long)local_4a0);
  }
  if ((char)local_510.data_ == '\0') {
    testing::Message::Message((Message *)&local_4e8);
    if (local_508 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_508->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_500,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_500,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_500);
    if (local_4e8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_4e8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_508,local_508);
  }
  lVar1 = 0x18;
  local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)((long)&(local_500.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first +
                  *(long *)((long)&local_488.sets_._M_elems[0].set_.ctrl_ + lVar1));
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_510.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)&local_4e8,"m.bucket_count()","123",(unsigned_long *)&local_500,
             (int *)&local_510);
  if (local_4e8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_500);
    if (local_4e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_4e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_510,(Message *)&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    if (local_500.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_500.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_4e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4e0,local_4e0);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_488);
  if (local_4c8._M_current != (pair<const_int,_int> *)0x0) {
    operator_delete(local_4c8._M_current,local_4b8 - (long)local_4c8._M_current);
  }
  return;
}

Assistant:

void InputIteratorBucketAllocTest(std::true_type) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m(values.begin(), values.end(), 123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}